

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Shader::Shader(Shader *this,mat4 M,mat4 MIT,mat4 MS,DepthBuffer *shadow_buffer)

{
  DepthBuffer *shadow_buffer_local;
  Shader *this_local;
  
  IShader::IShader(&this->super_IShader);
  (this->super_IShader)._vptr_IShader = (_func_int **)&PTR__Shader_00116d38;
  memcpy(&this->uniform_M,&M,0x80);
  memcpy(&this->uniform_MIT,&MIT,0x80);
  memcpy(&this->uniform_Mshadow,&MS,0x80);
  memset(&this->varying_uv,0,0x30);
  mat<2UL,_3UL>::mat(&this->varying_uv);
  memset(&this->varying_tri,0,0x48);
  mat<3UL,_3UL>::mat(&this->varying_tri);
  this->shadow_buffer = shadow_buffer;
  return;
}

Assistant:

Shader(mat4 M, mat4 MIT, mat4 MS, DepthBuffer& shadow_buffer)
        : uniform_M(M),
          uniform_MIT(MIT),
          uniform_Mshadow(MS),
          varying_uv(),
          shadow_buffer(shadow_buffer),
          varying_tri()
    {}